

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O1

void __thiscall
cmSearchPath::AddPrefixPaths
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,char *base)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  pointer path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string subdir;
  string add;
  string dir;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  char *local_180;
  string local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  char *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  string local_f8;
  string local_c8;
  pointer local_a8;
  string local_a0;
  string local_80;
  string local_50;
  
  local_180 = base;
  if (this->FC == (cmFindCommon *)0x0) {
    __assert_fail("this->FC != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSearchPath.cxx"
                  ,0x9c,
                  "void cmSearchPath::AddPrefixPaths(const std::vector<std::string> &, const char *)"
                 );
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"bin","");
  iVar5 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
  if (iVar5 == 0) {
    pcVar3 = "!include";
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
      if (iVar5 == 0) {
        local_1a0._M_string_length = 0;
        *local_1a0._M_dataplus._M_p = '\0';
      }
      goto LAB_002cec15;
    }
    pcVar3 = ".lib";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_1a0,0,(char *)local_1a0._M_string_length,(ulong)(pcVar3 + 1));
LAB_002cec15:
  path = (paths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (path != local_a8) {
    do {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      pcVar1 = (path->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,pcVar1,pcVar1 + path->_M_string_length);
      if ((((char *)local_1a0._M_string_length != (char *)0x0) &&
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_138._M_string_length !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) && ((local_138._M_dataplus._M_p + -1)[local_138._M_string_length] != '/')) {
        std::__cxx11::string::append((char *)&local_138);
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_138._M_dataplus._M_p,
                 (char *)(local_138._M_string_length + (long)local_138._M_dataplus._M_p));
      if ((local_118._M_string_length != 0) &&
         (iVar5 = std::__cxx11::string::compare((char *)&local_118), iVar5 != 0)) {
        if (local_118._M_string_length == 0) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
          ;
        }
        local_118._M_dataplus._M_p[local_118._M_string_length - 1] = '\0';
        local_118._M_string_length = local_118._M_string_length - 1;
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_1a0);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_1a0), iVar5 == 0)) {
        pcVar2 = this->FC->Makefile;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,"CMAKE_LIBRARY_ARCHITECTURE","");
        psVar6 = (string *)cmMakefile::GetDefinition(pcVar2,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          (ulong)(local_178.field_2._M_allocated_capacity + 1));
        }
        if ((psVar6 != (string *)0x0) && (psVar6->_M_string_length != 0)) {
          pcVar2 = this->FC->Makefile;
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"CMAKE_SYSROOT","");
          bVar4 = cmMakefile::IsDefinitionSet(pcVar2,&local_178);
          if (bVar4) {
            pcVar2 = this->FC->Makefile;
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"CMAKE_PREFIX_LIBRARY_ARCHITECTURE","");
            bVar4 = cmMakefile::IsDefinitionSet(pcVar2,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            (ulong)(local_178.field_2._M_allocated_capacity + 1));
          }
          if (psVar6 == (string *)0x0) {
            psVar6 = &cmValue::Empty_abi_cxx11_;
          }
          if (bVar4 == false) {
            local_178._M_dataplus._M_p = (pointer)local_138._M_string_length;
            local_178._M_string_length = (size_type)local_138._M_dataplus._M_p;
            local_178.field_2._M_allocated_capacity = local_1a0._M_string_length;
            local_178.field_2._8_8_ = local_1a0._M_dataplus._M_p;
            local_f8._M_dataplus._M_p = &DAT_00000001;
            local_150 = &local_f8.field_2;
            local_f8.field_2._M_local_buf[0] = '/';
            local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1;
            local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(psVar6->_M_dataplus)._M_p;
            local_148 = (char *)psVar6->_M_string_length;
            views_01._M_len = 4;
            views_01._M_array = (iterator)&local_178;
            local_f8._M_string_length = (size_type)local_150;
            cmCatViews_abi_cxx11_(&local_80,views_01);
            AddPathInternal(this,&local_80,&local_118,local_180);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              uVar7 = CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]);
              _Var8._M_p = local_80._M_dataplus._M_p;
              goto LAB_002cf099;
            }
          }
          else {
            local_f8._M_dataplus._M_p = &DAT_00000001;
            local_178._M_string_length = (size_type)&local_f8.field_2;
            local_f8.field_2._M_local_buf[0] = '/';
            local_178.field_2._8_8_ = (psVar6->_M_dataplus)._M_p;
            local_178.field_2._M_allocated_capacity = psVar6->_M_string_length;
            local_178._M_dataplus._M_p = &DAT_00000001;
            local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_string_length;
            local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p;
            local_148 = (char *)local_1a0._M_string_length;
            local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a0._M_dataplus._M_p;
            views._M_len = 4;
            views._M_array = (iterator)&local_178;
            local_f8._M_string_length = local_178._M_string_length;
            cmCatViews_abi_cxx11_(&local_a0,views);
            local_80._M_dataplus._M_p = &DAT_00000001;
            local_178._M_string_length = (size_type)&local_80.field_2;
            local_80.field_2._M_local_buf[0] = '/';
            local_178.field_2._8_8_ = (psVar6->_M_dataplus)._M_p;
            local_178.field_2._M_allocated_capacity = psVar6->_M_string_length;
            local_178._M_dataplus._M_p = &DAT_00000001;
            local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_string_length;
            local_150 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p;
            views_00._M_len = 3;
            views_00._M_array = (iterator)&local_178;
            local_80._M_string_length = local_178._M_string_length;
            cmCatViews_abi_cxx11_(&local_50,views_00);
            AddPathInternal(this,&local_a0,&local_50,local_180);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            uVar7 = local_a0.field_2._M_allocated_capacity;
            _Var8._M_p = local_a0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_002cf099:
              operator_delete(_Var8._M_p,uVar7 + 1);
            }
          }
        }
      }
      std::operator+(&local_178,&local_138,&local_1a0);
      iVar5 = std::__cxx11::string::compare((char *)&local_178);
      if (iVar5 != 0) {
        AddPathInternal(this,&local_178,&local_118,local_180);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_1a0);
      if (iVar5 == 0) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_138._M_dataplus._M_p,
                   (char *)(local_138._M_string_length + (long)local_138._M_dataplus._M_p));
        std::__cxx11::string::append((char *)&local_f8);
        AddPathInternal(this,&local_f8,&local_118,local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
      }
      if (((char *)local_1a0._M_string_length != (char *)0x0) &&
         (iVar5 = std::__cxx11::string::compare((char *)path), iVar5 != 0)) {
        AddPathInternal(this,path,&local_118,local_180);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,
                        (ulong)(local_178.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      path = path + 1;
    } while (path != local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSearchPath::AddPrefixPaths(const std::vector<std::string>& paths,
                                  const char* base)
{
  assert(this->FC != nullptr);

  // default for programs
  std::string subdir = "bin";

  if (this->FC->CMakePathName == "INCLUDE") {
    subdir = "include";
  } else if (this->FC->CMakePathName == "LIBRARY") {
    subdir = "lib";
  } else if (this->FC->CMakePathName == "FRAMEWORK") {
    subdir.clear(); // ? what to do for frameworks ?
  }

  for (std::string const& path : paths) {
    std::string dir = path;
    if (!subdir.empty() && !dir.empty() && dir.back() != '/') {
      dir += "/";
    }
    std::string prefix = dir;
    if (!prefix.empty() && prefix != "/") {
      prefix.erase(prefix.size() - 1);
    }
    if (subdir == "include" || subdir == "lib") {
      cmValue arch =
        this->FC->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE");
      if (cmNonempty(arch)) {
        if (this->FC->Makefile->IsDefinitionSet("CMAKE_SYSROOT") &&
            this->FC->Makefile->IsDefinitionSet(
              "CMAKE_PREFIX_LIBRARY_ARCHITECTURE")) {
          this->AddPathInternal(cmStrCat('/', *arch, dir, subdir),
                                cmStrCat('/', *arch, prefix), base);
        } else {
          this->AddPathInternal(cmStrCat(dir, subdir, '/', *arch), prefix,
                                base);
        }
      }
    }
    std::string add = dir + subdir;
    if (add != "/") {
      this->AddPathInternal(add, prefix, base);
    }
    if (subdir == "bin") {
      this->AddPathInternal(dir + "sbin", prefix, base);
    }
    if (!subdir.empty() && path != "/") {
      this->AddPathInternal(path, prefix, base);
    }
  }
}